

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderError5InputBlocks::getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError5InputBlocks *this,
          uint n_program_object)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(isolines) in;\n\nin IN_TC\n{\n    vec4 input_block_input;\n} input_block[11];\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position * input_block[0].input_block_input;\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError5InputBlocks::getTessellationEvaluationShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout(isolines) in;\n"
		   "\n"
		   /* Invalid input block size */
		   "in IN_TC\n"
		   "{\n"
		   "    vec4 input_block_input;\n"
		   "} input_block[11];\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_Position = gl_in[0].gl_Position * input_block[0].input_block_input;\n"
		   "}\n";
}